

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  undefined8 this_00;
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  cmMakefile *pcVar4;
  string *psVar5;
  string *psVar6;
  ostream *poVar7;
  LocalGeneratorVector *this_01;
  reference this_02;
  pointer pcVar8;
  reference this_03;
  pointer pcVar9;
  char *pcVar10;
  reference target_00;
  string_view sVar11;
  string *f;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  cmAlphaNum local_220;
  undefined1 local_1f0 [8];
  string fastTarget;
  allocator<char> local_199;
  string local_198;
  cmValue local_178;
  cmValue editCommand;
  bool insertTarget;
  string *targetName;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  undefined1 local_138 [7];
  bool topLevel;
  string currentDir;
  GeneratorTargetVector *targets;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string *local_a0;
  string *homeOutputDir;
  string local_90;
  string *local_70;
  string *makeArgs;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *make;
  cmMakefile *mf;
  cmGeneratedFileStream *fout_local;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  mf = (cmMakefile *)fout;
  fout_local = (cmGeneratedFileStream *)lg;
  lg_local = (cmLocalGenerator *)this;
  pcVar4 = cmLocalGenerator::GetMakefile(lg);
  make = (string *)pcVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_MAKE_PROGRAM",&local_51);
  psVar5 = cmMakefile::GetRequiredDefinition(pcVar4,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  psVar6 = make;
  local_30 = psVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_KATE_MAKE_ARGUMENTS",
             (allocator<char> *)((long)&homeOutputDir + 7));
  psVar6 = cmMakefile::GetSafeDefinition((cmMakefile *)psVar6,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&homeOutputDir + 7));
  local_70 = psVar6;
  local_a0 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)fout_local);
  poVar7 = std::operator<<((ostream *)mf,"\t\"build\": {\n\t\t\"directory\": \"");
  poVar7 = std::operator<<(poVar7,(string *)local_a0);
  std::operator<<(poVar7,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar7 = std::operator<<((ostream *)mf,"\t\t\"build\": \"");
  poVar7 = std::operator<<(poVar7,(string *)local_30);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)local_a0);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)local_70);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"all\",\n");
  poVar7 = std::operator<<((ostream *)mf,"\t\t\"clean\": \"");
  poVar7 = std::operator<<(poVar7,(string *)local_30);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)local_a0);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)local_70);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"clean\",\n");
  poVar7 = std::operator<<((ostream *)mf,"\t\t\"quick\": \"");
  poVar7 = std::operator<<(poVar7,(string *)local_30);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)local_a0);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)local_70);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"install\",\n");
  std::operator<<((ostream *)mf,"\t\t\"targets\":[\n");
  pcVar4 = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"all",&local_c1);
  AppendTarget(this,(cmGeneratedFileStream *)pcVar4,&local_c0,local_30,local_70,local_a0,local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pcVar4 = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"clean",(allocator<char> *)((long)&__range1 + 7));
  AppendTarget(this,(cmGeneratedFileStream *)pcVar4,&local_e8,local_30,local_70,local_a0,local_a0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(this_01);
  localGen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
             std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                *)&localGen);
    if (!bVar1) {
      std::operator<<((ostream *)mf,"\t] }\n");
      return;
    }
    this_02 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
              ::operator*(&__end1);
    pcVar8 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_02);
    currentDir.field_2._8_8_ = cmLocalGenerator::GetGeneratorTargets(pcVar8);
    pcVar8 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_02);
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar8);
    std::__cxx11::string::string((string *)local_138,(string *)psVar6);
    pcVar8 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_02);
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar8);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,psVar6);
    this_00 = currentDir.field_2._8_8_;
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin((vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                      *)currentDir.field_2._8_8_);
    target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
             std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::end((vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                       *)&target), bVar1) {
      this_03 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                ::operator*(&__end2);
      pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(this_03);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar9);
      pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(this_03);
      TVar3 = cmGeneratorTarget::GetType(pcVar9);
      if (TVar3 < UTILITY) {
        AppendTarget(this,(cmGeneratedFileStream *)mf,psVar6,local_30,local_70,(string *)local_138,
                     local_a0);
        cmAlphaNum::cmAlphaNum(&local_220,psVar6);
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"/fast");
        cmStrCat<>((string *)local_1f0,&local_220,
                   (cmAlphaNum *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        AppendTarget(this,(cmGeneratedFileStream *)mf,(string *)local_1f0,local_30,local_70,
                     (string *)local_138,local_a0);
        std::__cxx11::string::~string((string *)local_1f0);
      }
      else if (TVar3 == UTILITY) {
        sVar11 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        bVar1 = cmHasLiteralPrefix<8ul>(sVar11,(char (*) [8])"Nightly");
        if ((!bVar1) || (bVar1 = std::operator!=(psVar6,"Nightly"), !bVar1)) {
          sVar11 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
          bVar1 = cmHasLiteralPrefix<11ul>(sVar11,(char (*) [11])"Continuous");
          if ((!bVar1) || (bVar1 = std::operator!=(psVar6,"Continuous"), !bVar1)) {
            sVar11 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
            fastTarget.field_2._8_8_ = sVar11._M_len;
            bVar1 = cmHasLiteralPrefix<13ul>(sVar11,(char (*) [13])"Experimental");
            if ((!bVar1) || (bVar1 = std::operator!=(psVar6,"Experimental"), !bVar1)) {
              AppendTarget(this,(cmGeneratedFileStream *)mf,psVar6,local_30,local_70,
                           (string *)local_138,local_a0);
            }
          }
        }
      }
      else if (TVar3 == GLOBAL_TARGET) {
        editCommand.Value._7_1_ = 0;
        if (_Var2) {
          editCommand.Value._7_1_ = 1;
          bVar1 = std::operator==(psVar6,"edit_cache");
          if (bVar1) {
            pcVar8 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                     operator->(this_02);
            pcVar4 = cmLocalGenerator::GetMakefile(pcVar8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_198,"CMAKE_EDIT_COMMAND",&local_199);
            local_178 = cmMakefile::GetDefinition(pcVar4,&local_198);
            std::__cxx11::string::~string((string *)&local_198);
            std::allocator<char>::~allocator(&local_199);
            bVar1 = cmValue::operator_cast_to_bool(&local_178);
            if (bVar1) {
              cmValue::operator->[abi_cxx11_(&local_178);
              pcVar10 = (char *)std::__cxx11::string::c_str();
              pcVar10 = strstr(pcVar10,"ccmake");
              if (pcVar10 == (char *)0x0) goto LAB_006cbcff;
            }
            editCommand.Value._7_1_ = 0;
          }
        }
LAB_006cbcff:
        if ((editCommand.Value._7_1_ & 1) != 0) {
          AppendTarget(this,(cmGeneratedFileStream *)mf,psVar6,local_30,local_70,(string *)local_138
                       ,local_a0);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2_1);
    pcVar8 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_02);
    cmLocalGenerator::GetIndividualFileTargets
              (pcVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2_1);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
    f = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&f), bVar1) {
      target_00 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      AppendTarget(this,(cmGeneratedFileStream *)mf,target_00,local_30,local_70,(string *)local_138,
                   local_a0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_1);
    std::__cxx11::string::~string((string *)local_138);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator& lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg.GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg.GetBinaryDirectory();

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (const auto& localGen : this->GlobalGenerator->GetLocalGenerators()) {
    const auto& targets = localGen->GetGeneratorTargets();
    std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (const auto& target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              cmValue editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (!editCommand ||
                  strstr(editCommand->c_str(), "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                               homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(fout, fastTarget, make, makeArgs, currentDir,
                             homeOutputDir);

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, make, makeArgs, currentDir, homeOutputDir);
    }
  }

  fout << "\t] }\n";
}